

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O2

void __thiscall pg::ZLKQSolver::run(ZLKQSolver *this)

{
  bitset *this_00;
  bitset *this_01;
  int iVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  ostream *poVar5;
  int v;
  ulong uVar6;
  int v_1;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Game *pGVar10;
  _label_vertex local_60;
  bitset G;
  
  this->iterations = 0;
  pGVar10 = (this->super_Solver).game;
  uVar9 = pGVar10->n_vertices << 2;
  piVar3 = (int *)operator_new__(-(ulong)((ulong)pGVar10->n_vertices >> 0x3e != 0) | uVar9);
  this->str = piVar3;
  (this->Q).pointer = 0;
  puVar4 = (this->Q).queue;
  if (puVar4 != (uint *)0x0) {
    operator_delete__(puVar4);
    pGVar10 = (this->super_Solver).game;
  }
  puVar4 = (uint *)operator_new__(uVar9 & 0x3fffffffc);
  (this->Q).queue = puVar4;
  this_00 = &this->W0;
  bitset::resize(this_00,pGVar10->n_vertices);
  this_01 = &this->W1;
  bitset::resize(this_01,((this->super_Solver).game)->n_vertices);
  bitset::bitset(&G,((this->super_Solver).game)->n_vertices);
  bitset::operator=(&G,(this->super_Solver).disabled);
  bitset::flip(&G);
  iVar2 = (int)((this->super_Solver).game)->n_vertices;
  solve(this,&G,iVar2 + -1,iVar2,iVar2);
  if ((this->super_Solver).trace != 0) {
    for (uVar9 = 0; (long)uVar9 < ((this->super_Solver).game)->n_vertices; uVar9 = uVar9 + 1) {
      uVar7 = uVar9 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar7] >> (uVar9 & 0x3f) & 1) == 0) {
        poVar5 = std::operator<<((this->super_Solver).logger,"vertex ");
        local_60.g = (this->super_Solver).game;
        iVar2 = (int)uVar9;
        local_60.v = iVar2;
        poVar5 = operator<<(poVar5,&local_60);
        std::operator<<(poVar5," is solved by");
        uVar8 = 1L << (uVar9 & 0x3f);
        if ((this_00->_bits[uVar7] & uVar8) != 0) {
          std::operator<<((this->super_Solver).logger," even");
          iVar1 = Solver::owner(&this->super_Solver,iVar2);
          if (iVar1 == 0) {
            std::operator<<((this->super_Solver).logger," (");
            poVar5 = (this->super_Solver).logger;
            if (this->str[uVar9] == -1) {
              std::operator<<(poVar5,"-1");
            }
            else {
              local_60.g = (this->super_Solver).game;
              local_60.v = this->str[uVar9];
              operator<<(poVar5,&local_60);
            }
            std::operator<<((this->super_Solver).logger,")");
          }
        }
        if ((this_01->_bits[uVar7] & uVar8) != 0) {
          std::operator<<((this->super_Solver).logger," odd");
          iVar2 = Solver::owner(&this->super_Solver,iVar2);
          if (iVar2 == 1) {
            std::operator<<((this->super_Solver).logger," (");
            poVar5 = (this->super_Solver).logger;
            if (this->str[uVar9] == -1) {
              std::operator<<(poVar5,"-1");
            }
            else {
              local_60.g = (this->super_Solver).game;
              local_60.v = this->str[uVar9];
              operator<<(poVar5,&local_60);
            }
            std::operator<<((this->super_Solver).logger,")");
          }
        }
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
      }
    }
  }
  for (uVar9 = 0; (long)uVar9 < ((this->super_Solver).game)->n_vertices; uVar9 = uVar9 + 1) {
    uVar7 = uVar9 >> 6;
    if ((((this->super_Solver).disabled)->_bits[uVar7] >> (uVar9 & 0x3f) & 1) == 0) {
      uVar8 = 1L << (uVar9 & 0x3f);
      if ((this_00->_bits[uVar7] & uVar8) != 0) {
        Solver::solve(&this->super_Solver,(int)uVar9,0,this->str[uVar9]);
      }
      if ((this_01->_bits[uVar7] & uVar8) != 0) {
        Solver::solve(&this->super_Solver,(int)uVar9,1,this->str[uVar9]);
      }
    }
  }
  poVar5 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
  poVar5 = std::operator<<(poVar5," iterations.");
  std::endl<char,std::char_traits<char>>(poVar5);
  uVar7 = ((this->super_Solver).game)->n_vertices;
  uVar9 = 0;
  do {
    if ((~((long)uVar7 >> 0x3f) & uVar7) == uVar9) {
      if (this->str != (int *)0x0) {
        operator_delete__(this->str);
      }
      bitset::~bitset(&G);
      return;
    }
    uVar6 = uVar9 >> 6;
    uVar8 = uVar9 & 0x3f;
    uVar9 = uVar9 + 1;
  } while ((((this->super_Solver).disabled)->_bits[uVar6] >> uVar8 & 1) != 0);
  poVar5 = std::operator<<((this->super_Solver).logger,"search was incomplete!");
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(-1);
}

Assistant:

void
ZLKQSolver::run()
{
    iterations = 0;

    str = new int[nodecount()];

    Q.resize(nodecount());
    W0.resize(nodecount());
    W1.resize(nodecount());

    bitset G(nodecount());
    G = disabled;
    G.flip();

    solve(G, nodecount()-1, nodecount(), nodecount());

#ifndef NDEBUG
    if (trace) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            logger << "vertex " << label_vertex(v) << " is solved by";
            if (W0[v]) {
                logger << " even";
                if (owner(v) == 0) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            if (W1[v]) {
                logger << " odd";
                if (owner(v) == 1) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            logger << std::endl;
        }
    }
#endif

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (W0[v]) Solver::solve(v, 0, str[v]);
        if (W1[v]) Solver::solve(v, 1, str[v]);
    }

    logger << "solved with " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { logger << "search was incomplete!" << std::endl; exit(-1); }
    }
#endif

    delete[] str;
}